

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O2

uint8_t * __thiscall
MPEGSequenceHeader::deserializeDisplayExtension(MPEGSequenceHeader *this,BitStreamReader *bitReader)

{
  bool bVar1;
  uint uVar2;
  uint8_t *puVar3;
  
  uVar2 = BitStreamReader::getBits(bitReader,3);
  this->video_format = (uint8_t)uVar2;
  bVar1 = BitStreamReader::getBit(bitReader);
  if (bVar1) {
    uVar2 = BitStreamReader::getBits(bitReader,8);
    this->color_primaries = (uint8_t)uVar2;
    uVar2 = BitStreamReader::getBits(bitReader,8);
    this->transfer_characteristics = (uint8_t)uVar2;
    uVar2 = BitStreamReader::getBits(bitReader,8);
    this->matrix_coefficients = (uint8_t)uVar2;
  }
  uVar2 = BitStreamReader::getBits(bitReader,0xe);
  this->pan_scan_width = uVar2 << 4;
  BitStreamReader::skipBit(bitReader);
  uVar2 = BitStreamReader::getBits(bitReader,0xe);
  this->pan_scan_height = uVar2 << 4;
  BitStreamReader::skipBit(bitReader);
  puVar3 = MPEGHeader::skipProcessedBytes(bitReader);
  return puVar3;
}

Assistant:

uint8_t* MPEGSequenceHeader::deserializeDisplayExtension(BitStreamReader& bitReader)
{
    // MpegEncContext *s= &s1->mpeg_enc_ctx;
    video_format = bitReader.getBits<uint8_t>(3); /* video format */

    if (bitReader.getBit())  // color_description
    {
        color_primaries = bitReader.getBits<uint8_t>(8);          /* color primaries */
        transfer_characteristics = bitReader.getBits<uint8_t>(8); /* transfer_characteristics */
        matrix_coefficients = bitReader.getBits<uint8_t>(8);      /* matrix_coefficients */
    }

    pan_scan_width = bitReader.getBits(14) << 4;
    bitReader.skipBit();  // marker
    pan_scan_height = bitReader.getBits(14) << 4;
    bitReader.skipBit();  // marker

    // return bitContext.buffer_ptr;
    return skipProcessedBytes(bitReader);
}